

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O1

void __thiscall
duckdb::CSVSniffer::SniffTypes
          (CSVSniffer *this,DataChunk *data_chunk,CSVStateMachine *state_machine,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *info_sql_types_candidates,idx_t start_idx_detection)

{
  string_t *dummy_val;
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  reference vector;
  mapped_type *this_01;
  reference pvVar13;
  ulong uVar14;
  unsigned_long __n;
  reference pvVar15;
  CSVBufferManager *pCVar16;
  bool bVar17;
  bool bVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *pbVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  LogicalType *pLVar26;
  byte *__s2;
  string_t value;
  char in_stack_fffffffffffffe48;
  bool local_1ac;
  ulong local_198;
  key_type local_168;
  string separator;
  value_type cur_top_candidate;
  LogicalType local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  uVar3 = data_chunk->count;
  local_168 = 0;
  if ((data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar18 = false;
    bVar17 = false;
    do {
      vector = vector<duckdb::Vector,_true>::operator[](&data_chunk->data,local_168);
      pdVar4 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      this_00 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      this_01 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)info_sql_types_candidates,&local_168);
      local_198 = start_idx_detection;
      if (start_idx_detection < uVar3) {
        do {
          pvVar13 = vector<duckdb::LogicalType,_true>::back(this_01);
          LogicalType::LogicalType(&cur_top_candidate,pvVar13);
          uVar14 = 1L << ((byte)local_198 & 0x3f);
          dummy_val = (string_t *)(pdVar4 + local_198 * 0x10);
          do {
            if ((ulong)(((long)(this_01->
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ).
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ).
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) < 2) break;
            pvVar13 = vector<duckdb::LogicalType,_true>::back(this_01);
            separator._M_dataplus._M_p = (pointer)&separator.field_2;
            separator._M_string_length = 0;
            separator.field_2._M_local_buf[0] = '\0';
            if ((puVar5 == (unsigned_long *)0x0) || ((puVar5[local_198 >> 6] & uVar14) != 0)) {
              uVar2 = (dummy_val->value).pointer.length;
              uVar24 = (ulong)uVar2;
              pbVar19 = pdVar4 + local_198 * 0x10 + 4;
              if (0xc < uVar24) {
                pbVar19 = (byte *)(dummy_val->value).pointer.ptr;
              }
              pbVar1 = pbVar19 + uVar24;
              if (3 < uVar24) {
                lVar25 = (ulong)(uVar2 >> 2) + 1;
                pbVar19 = pbVar19 + 3;
                do {
                  pbVar20 = pbVar19;
                  if ((4 < pbVar20[-3] - 9) && (pbVar20[-3] != 0x20)) {
                    pbVar20 = pbVar20 + -3;
                    goto LAB_00b936ad;
                  }
                  if ((4 < pbVar20[-2] - 9) && (pbVar20[-2] != 0x20)) {
                    pbVar20 = pbVar20 + -2;
                    goto LAB_00b936ad;
                  }
                  if ((4 < pbVar20[-1] - 9) && (pbVar20[-1] != 0x20)) {
                    pbVar20 = pbVar20 + -1;
                    goto LAB_00b936ad;
                  }
                  if ((4 < *pbVar20 - 9) && (*pbVar20 != 0x20)) goto LAB_00b936ad;
                  lVar25 = lVar25 + -1;
                  pbVar19 = pbVar20 + 4;
                } while (1 < lVar25);
                pbVar19 = pbVar20 + 1;
              }
              lVar25 = (long)pbVar1 - (long)pbVar19;
              if (lVar25 == 1) {
LAB_00b9369b:
                pbVar20 = pbVar1;
                if ((4 < *pbVar19 - 9) && (pbVar20 = pbVar19, *pbVar19 == 0x20)) {
                  pbVar20 = pbVar1;
                }
              }
              else {
                pbVar20 = pbVar19;
                if (lVar25 == 2) {
LAB_00b93689:
                  if ((*pbVar20 - 9 < 5) || (*pbVar20 == 0x20)) {
                    pbVar19 = pbVar20 + 1;
                    goto LAB_00b9369b;
                  }
                }
                else {
                  pbVar20 = pbVar1;
                  if ((lVar25 == 3) && ((*pbVar19 - 9 < 5 || (pbVar20 = pbVar19, *pbVar19 == 0x20)))
                     ) {
                    pbVar20 = pbVar19 + 1;
                    goto LAB_00b93689;
                  }
                }
              }
LAB_00b936ad:
              if ((pbVar20 != pbVar1) && ((byte)(*pbVar20 - 0x30) < 10)) {
                lVar25 = (long)pbVar1 - (long)pbVar20 >> 2;
                pbVar19 = pbVar20;
                if (0 < lVar25) {
                  pbVar19 = pbVar20 + ((long)pbVar1 - (long)pbVar20 & 0xfffffffffffffffc);
                  lVar25 = lVar25 + 1;
                  pbVar20 = pbVar20 + 3;
                  do {
                    if (9 < (byte)(pbVar20[-3] - 0x30)) {
                      pbVar20 = pbVar20 + -3;
                      goto LAB_00b937df;
                    }
                    if (9 < (byte)(pbVar20[-2] - 0x30)) {
                      pbVar20 = pbVar20 + -2;
                      goto LAB_00b937df;
                    }
                    if (9 < (byte)(pbVar20[-1] - 0x30)) {
                      pbVar20 = pbVar20 + -1;
                      goto LAB_00b937df;
                    }
                    if (9 < (byte)(*pbVar20 - 0x30)) goto LAB_00b937df;
                    lVar25 = lVar25 + -1;
                    pbVar20 = pbVar20 + 4;
                  } while (1 < lVar25);
                }
                lVar25 = (long)pbVar1 - (long)pbVar19;
                if (lVar25 == 1) {
LAB_00b9376f:
                  pbVar20 = pbVar19;
                  if ((byte)(*pbVar19 - 0x30) < 10) {
                    pbVar20 = pbVar1;
                  }
                }
                else if (lVar25 == 2) {
LAB_00b93762:
                  pbVar20 = pbVar19;
                  if ((byte)(*pbVar19 - 0x30) < 10) {
                    pbVar19 = pbVar19 + 1;
                    goto LAB_00b9376f;
                  }
                }
                else {
                  pbVar20 = pbVar1;
                  if ((lVar25 == 3) && (pbVar20 = pbVar19, (byte)(*pbVar19 - 0x30) < 10)) {
                    pbVar19 = pbVar19 + 1;
                    goto LAB_00b93762;
                  }
                }
LAB_00b937df:
                if (pbVar20 != pbVar1) {
                  lVar25 = (long)pbVar1 - (long)pbVar20 >> 2;
                  pbVar19 = pbVar20;
                  if (0 < lVar25) {
                    pbVar19 = pbVar20 + ((long)pbVar1 - (long)pbVar20 & 0xfffffffffffffffc);
                    lVar25 = lVar25 + 1;
                    pbVar22 = pbVar20 + 3;
                    do {
                      if ((byte)(pbVar22[-3] - 0x30) < 10) {
                        pbVar22 = pbVar22 + -3;
                        goto LAB_00b938ae;
                      }
                      if ((byte)(pbVar22[-2] - 0x30) < 10) {
                        pbVar22 = pbVar22 + -2;
                        goto LAB_00b938ae;
                      }
                      if ((byte)(pbVar22[-1] - 0x30) < 10) {
                        pbVar22 = pbVar22 + -1;
                        goto LAB_00b938ae;
                      }
                      if ((byte)(*pbVar22 - 0x30) < 10) goto LAB_00b938ae;
                      lVar25 = lVar25 + -1;
                      pbVar22 = pbVar22 + 4;
                    } while (1 < lVar25);
                  }
                  lVar25 = (long)pbVar1 - (long)pbVar19;
                  if (lVar25 == 1) {
LAB_00b9389e:
                    pbVar22 = pbVar19;
                    if (9 < (byte)(*pbVar19 - 0x30)) {
                      pbVar22 = pbVar1;
                    }
                  }
                  else if (lVar25 == 2) {
LAB_00b9387b:
                    pbVar22 = pbVar19;
                    if (9 < (byte)(*pbVar19 - 0x30)) {
                      pbVar19 = pbVar19 + 1;
                      goto LAB_00b9389e;
                    }
                  }
                  else {
                    pbVar22 = pbVar1;
                    if ((lVar25 == 3) && (pbVar22 = pbVar19, 9 < (byte)(*pbVar19 - 0x30))) {
                      pbVar19 = pbVar19 + 1;
                      goto LAB_00b9387b;
                    }
                  }
LAB_00b938ae:
                  if (pbVar22 != pbVar1) {
                    lVar25 = (long)pbVar1 - (long)pbVar22 >> 2;
                    pbVar19 = pbVar22;
                    if (0 < lVar25) {
                      pbVar19 = pbVar22 + ((long)pbVar1 - (long)pbVar22 & 0xfffffffffffffffc);
                      lVar25 = lVar25 + 1;
                      __s2 = pbVar22 + 3;
                      do {
                        if (9 < (byte)(__s2[-3] - 0x30)) {
                          __s2 = __s2 + -3;
                          goto LAB_00b93980;
                        }
                        if (9 < (byte)(__s2[-2] - 0x30)) {
                          __s2 = __s2 + -2;
                          goto LAB_00b93980;
                        }
                        if (9 < (byte)(__s2[-1] - 0x30)) {
                          __s2 = __s2 + -1;
                          goto LAB_00b93980;
                        }
                        if (9 < (byte)(*__s2 - 0x30)) goto LAB_00b93980;
                        lVar25 = lVar25 + -1;
                        __s2 = __s2 + 4;
                      } while (1 < lVar25);
                    }
                    lVar25 = (long)pbVar1 - (long)pbVar19;
                    if (lVar25 == 1) {
LAB_00b9395a:
                      __s2 = pbVar19;
                      if ((byte)(*pbVar19 - 0x30) < 10) {
                        __s2 = pbVar1;
                      }
                    }
                    else if (lVar25 == 2) {
LAB_00b9394d:
                      __s2 = pbVar19;
                      if ((byte)(*pbVar19 - 0x30) < 10) {
                        pbVar19 = pbVar19 + 1;
                        goto LAB_00b9395a;
                      }
                    }
                    else {
                      __s2 = pbVar1;
                      if ((lVar25 == 3) && (__s2 = pbVar19, (byte)(*pbVar19 - 0x30) < 10)) {
                        pbVar19 = pbVar19 + 1;
                        goto LAB_00b9394d;
                      }
                    }
LAB_00b93980:
                    if (__s2 != pbVar1) {
                      lVar25 = (long)pbVar1 - (long)__s2 >> 2;
                      pbVar19 = __s2;
                      if (0 < lVar25) {
                        pbVar19 = __s2 + ((long)pbVar1 - (long)__s2 & 0xfffffffffffffffc);
                        lVar25 = lVar25 + 1;
                        pbVar21 = __s2 + 3;
                        do {
                          if ((byte)(pbVar21[-3] - 0x30) < 10) {
                            pbVar21 = pbVar21 + -3;
                            goto LAB_00b93a51;
                          }
                          if ((byte)(pbVar21[-2] - 0x30) < 10) {
                            pbVar21 = pbVar21 + -2;
                            goto LAB_00b93a51;
                          }
                          if ((byte)(pbVar21[-1] - 0x30) < 10) {
                            pbVar21 = pbVar21 + -1;
                            goto LAB_00b93a51;
                          }
                          if ((byte)(*pbVar21 - 0x30) < 10) goto LAB_00b93a51;
                          lVar25 = lVar25 + -1;
                          pbVar21 = pbVar21 + 4;
                        } while (1 < lVar25);
                      }
                      lVar25 = (long)pbVar1 - (long)pbVar19;
                      if (lVar25 == 1) {
LAB_00b93a3e:
                        pbVar21 = pbVar19;
                        if (9 < (byte)(*pbVar19 - 0x30)) {
                          pbVar21 = pbVar1;
                        }
                      }
                      else if (lVar25 == 2) {
LAB_00b93a1b:
                        pbVar21 = pbVar19;
                        if (9 < (byte)(*pbVar19 - 0x30)) {
                          pbVar19 = pbVar19 + 1;
                          goto LAB_00b93a3e;
                        }
                      }
                      else {
                        pbVar21 = pbVar1;
                        if ((lVar25 == 3) && (pbVar21 = pbVar19, 9 < (byte)(*pbVar19 - 0x30))) {
                          pbVar19 = pbVar19 + 1;
                          goto LAB_00b93a1b;
                        }
                      }
LAB_00b93a51:
                      if ((pbVar21 != pbVar1) &&
                         (lVar25 = (long)pbVar22 - (long)pbVar20,
                         (long)pbVar21 - (long)__s2 == lVar25)) {
                        __n = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar25);
                        iVar12 = strncmp((char *)pbVar20,(char *)__s2,__n);
                        if (iVar12 == 0) {
                          separator._M_string_length = 0;
                          *separator._M_dataplus._M_p = '\0';
                          if (pbVar20 < pbVar22) {
                            lVar23 = 0;
                            do {
                              if (pbVar20[lVar23] == 0x25) {
                                ::std::__cxx11::string::push_back((char)&separator);
                              }
                              ::std::__cxx11::string::push_back((char)&separator);
                              lVar23 = lVar23 + 1;
                            } while (lVar25 != lVar23);
                          }
                          pvVar15 = vector<duckdb::LogicalType,_true>::back(this_01);
                          if (((pvVar15->id_ == TIMESTAMP) && (!bVar18)) ||
                             ((pvVar15 = vector<duckdb::LogicalType,_true>::back(this_01),
                              pvVar15->id_ == DATE && (!bVar17)))) {
                            DetectDateAndTimeStampFormats
                                      (this,state_machine,pvVar13,&separator,dummy_val);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            LogicalType::LogicalType(&local_48,VARCHAR);
            bVar9 = LogicalType::operator==(pvVar13,&local_48);
            LogicalType::~LogicalType(&local_48);
            if (bVar9) {
LAB_00b93b44:
              bVar9 = false;
            }
            else {
              pCVar16 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                                  (&this->buffer_manager);
              if (puVar5 == (unsigned_long *)0x0) {
                bVar9 = false;
              }
              else {
                bVar9 = (puVar5[local_198 >> 6] & uVar14) == 0;
              }
              value.value.pointer.ptr = (char *)pvVar13;
              value.value._0_8_ = (dummy_val->value).pointer.ptr;
              bVar10 = CanYouCastIt((CSVSniffer *)pCVar16->context,
                                    *(ClientContext **)&dummy_val->value,value,
                                    (LogicalType *)&state_machine->dialect_options,
                                    (DialectOptions *)(ulong)bVar9,
                                    (bool)*(state_machine->options->decimal_separator)._M_dataplus.
                                           _M_p,state_machine->options->thousands_separator,
                                    in_stack_fffffffffffffe48);
              bVar9 = true;
              if (!bVar10) {
                if (local_198 == start_idx_detection) {
                  bVar8 = false;
                  bVar10 = false;
                  bVar7 = false;
                  bVar11 = false;
                  bVar6 = false;
                  local_1ac = false;
                }
                else {
                  LogicalType::LogicalType(&local_60,BOOLEAN);
                  bVar10 = LogicalType::operator==(&cur_top_candidate,&local_60);
                  if (bVar10) {
                    local_1ac = true;
                    bVar8 = false;
                    bVar10 = false;
                    bVar7 = false;
                    bVar11 = false;
                    bVar6 = false;
                  }
                  else {
                    LogicalType::LogicalType(&local_78,DATE);
                    bVar10 = LogicalType::operator==(&cur_top_candidate,&local_78);
                    if (bVar10) {
                      bVar10 = false;
LAB_00b93cc8:
                      bVar7 = false;
                      bVar11 = false;
                    }
                    else {
                      LogicalType::LogicalType(&local_90,TIME);
                      bVar10 = LogicalType::operator==(&cur_top_candidate,&local_90);
                      if (bVar10) {
                        bVar10 = true;
                        goto LAB_00b93cc8;
                      }
                      LogicalType::LogicalType(&local_a8,TIMESTAMP);
                      bVar11 = LogicalType::operator==(&cur_top_candidate,&local_a8);
                      if (!bVar11) {
LAB_00b93e24:
                        LogicalType::LogicalType(&local_d8,TIMESTAMP_TZ);
                        local_1ac = LogicalType::operator==(&cur_top_candidate,&local_d8);
                        bVar8 = true;
                        bVar10 = true;
                        bVar7 = true;
                        bVar6 = true;
                        goto LAB_00b93cd2;
                      }
                      pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                                          (this_01,((long)(this_01->
                                                                                                                    
                                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ).
                                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this_01->
                                                                                                                
                                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ).
                                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                  -0x5555555555555555 - 2);
                      LogicalType::LogicalType(&local_c0,TIMESTAMP_TZ);
                      bVar10 = LogicalType::operator==(pvVar13,&local_c0);
                      if (bVar10) goto LAB_00b93e24;
                      bVar10 = true;
                      bVar7 = true;
                      bVar11 = true;
                    }
                    bVar8 = true;
                    bVar6 = false;
                    local_1ac = true;
                  }
                }
LAB_00b93cd2:
                if (bVar6) {
                  LogicalType::~LogicalType(&local_d8);
                }
                if (bVar11 != false) {
                  LogicalType::~LogicalType(&local_c0);
                }
                if (bVar7) {
                  LogicalType::~LogicalType(&local_a8);
                }
                if (bVar10) {
                  LogicalType::~LogicalType(&local_90);
                }
                if (bVar8) {
                  LogicalType::~LogicalType(&local_78);
                }
                if (local_198 != start_idx_detection) {
                  LogicalType::~LogicalType(&local_60);
                }
                if (local_1ac == false) {
                  pLVar26 = (this_01->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  (this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pLVar26;
                  LogicalType::~LogicalType(pLVar26);
                  goto LAB_00b93b44;
                }
                while( true ) {
                  pvVar13 = vector<duckdb::LogicalType,_true>::back(this_01);
                  LogicalType::LogicalType(&local_48,VARCHAR);
                  bVar10 = LogicalType::operator==(pvVar13,&local_48);
                  LogicalType::~LogicalType(&local_48);
                  if (bVar10) break;
                  pLVar26 = (this_01->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  (this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pLVar26;
                  LogicalType::~LogicalType(pLVar26);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)separator._M_dataplus._M_p != &separator.field_2) {
              operator_delete(separator._M_dataplus._M_p);
            }
          } while (!bVar9);
          LogicalType::~LogicalType(&cur_top_candidate);
          local_198 = local_198 + 1;
        } while (local_198 != uVar3);
      }
      pvVar13 = vector<duckdb::LogicalType,_true>::back(this_01);
      if (pvVar13->id_ == DATE) {
        bVar17 = true;
      }
      pvVar13 = vector<duckdb::LogicalType,_true>::back(this_01);
      if (pvVar13->id_ == TIMESTAMP) {
        bVar18 = true;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_168 = local_168 + 1;
    } while (local_168 <
             (ulong)(((long)(data_chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(data_chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void CSVSniffer::SniffTypes(DataChunk &data_chunk, CSVStateMachine &state_machine,
                            unordered_map<idx_t, vector<LogicalType>> &info_sql_types_candidates,
                            idx_t start_idx_detection) {
	const idx_t chunk_size = data_chunk.size();
	HasType has_type;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		D_ASSERT(cur_vector.GetVectorType() == VectorType::FLAT_VECTOR);
		D_ASSERT(cur_vector.GetType() == LogicalType::VARCHAR);
		auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto null_mask = FlatVector::Validity(cur_vector);
		auto &col_type_candidates = info_sql_types_candidates[col_idx];
		for (idx_t row_idx = start_idx_detection; row_idx < chunk_size; row_idx++) {
			// col_type_candidates can't be empty since anything in a CSV file should at least be a string
			// and we validate utf-8 compatibility when creating the type
			D_ASSERT(!col_type_candidates.empty());
			auto cur_top_candidate = col_type_candidates.back();
			// try cast from string to sql_type
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				// try formatting for date types if the user did not specify one, and it starts with numeric
				// values.
				string separator;
				// If Value is not Null, Has a numeric date format, and the current investigated candidate is
				// either a timestamp or a date
				if (null_mask.RowIsValid(row_idx) && StartsWithNumericDate(separator, vector_data[row_idx]) &&
				    ((col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP && !has_type.timestamp) ||
				     (col_type_candidates.back().id() == LogicalTypeId::DATE && !has_type.date))) {
					DetectDateAndTimeStampFormats(state_machine, sql_type, separator, vector_data[row_idx]);
				}
				// try cast from string to sql_type
				if (sql_type == LogicalType::VARCHAR) {
					// Nothing to convert it to
					continue;
				}
				if (CanYouCastIt(buffer_manager->context, vector_data[row_idx], sql_type, state_machine.dialect_options,
				                 !null_mask.RowIsValid(row_idx), state_machine.options.decimal_separator[0],
				                 state_machine.options.thousands_separator)) {
					break;
				}
				D_ASSERT(cur_top_candidate.id() == LogicalTypeId::VARCHAR || col_type_candidates.size() > 1);
				if (row_idx != start_idx_detection &&
				    (cur_top_candidate == LogicalType::BOOLEAN || cur_top_candidate == LogicalType::DATE ||
				     cur_top_candidate == LogicalType::TIME ||
				     (cur_top_candidate == LogicalType::TIMESTAMP &&
				      col_type_candidates[col_type_candidates.size() - 2] != LogicalType::TIMESTAMP_TZ) ||
				     cur_top_candidate == LogicalType::TIMESTAMP_TZ)) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		if (col_type_candidates.back().id() == LogicalTypeId::DATE) {
			has_type.date = true;
		}
		if (col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP) {
			has_type.timestamp = true;
		}
	}
}